

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

uint fmt::v5::internal::
     parse_nonnegative_int<char,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,char>>>&>
               (char **begin,char *end,
               specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>_>
               *eh)

{
  char *pcVar1;
  char *pcVar2;
  uint uVar3;
  
  if (**begin == '0') {
    *begin = *begin + 1;
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    pcVar1 = *begin;
    while (pcVar2 = pcVar1 + 1, uVar3 < 0xccccccd) {
      uVar3 = ((int)*pcVar1 + uVar3 * 10) - 0x30;
      *begin = pcVar2;
      if ((pcVar2 == end) || (pcVar1 = pcVar2, 9 < (byte)(*pcVar2 - 0x30U))) goto LAB_001f3eb8;
    }
    uVar3 = 0x80000000;
LAB_001f3eb8:
    if ((int)uVar3 < 0) {
      error_handler::on_error
                ((error_handler *)
                 (eh->
                 super_specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
                 ).context_,"number is too big");
    }
  }
  return uVar3;
}

Assistant:

FMT_CONSTEXPR unsigned parse_nonnegative_int(
    const Char *&begin, const Char *end, ErrorHandler &&eh) {
  assert(begin != end && '0' <= *begin && *begin <= '9');
  if (*begin == '0') {
    ++begin;
    return 0;
  }
  unsigned value = 0;
  // Convert to unsigned to prevent a warning.
  unsigned max_int = (std::numeric_limits<int>::max)();
  unsigned big = max_int / 10;
  do {
    // Check for overflow.
    if (value > big) {
      value = max_int + 1;
      break;
    }
    value = value * 10 + unsigned(*begin - '0');
    ++begin;
  } while (begin != end && '0' <= *begin && *begin <= '9');
  if (value > max_int)
    eh.on_error("number is too big");
  return value;
}